

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

Message * __thiscall Message::str_abi_cxx11_(Message *this)

{
  ostream *poVar1;
  long in_RSI;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [384];
  Message *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"o=");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 8));
  poVar1 = std::operator<<(poVar1,", t=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(long *)(in_RSI + 0x28));
  poVar1 = std::operator<<(poVar1,", v=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RSI + 0x58));
  poVar1 = std::operator<<(poVar1,", n=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RSI + 0x60));
  poVar1 = std::operator<<(poVar1,", c=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x30));
  poVar1 = std::operator<<(poVar1,", d=");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 0x38));
  std::operator<<(poVar1,")");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

std::string Message::str() const{
    std::stringstream ss;
    ss
        <<"o="<<o
        <<", t="<<t
        <<", v="<<v
        <<", n="<<n
        <<", c="<<c
        <<", d="<<d
        <<")";
    return ss.str();
}